

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86_avx512::forward
          (Padding_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  int *piVar4;
  void *pvVar5;
  size_t sVar6;
  __m256 v;
  __m256 v_00;
  __m256 v_01;
  __m256 v_02;
  __m512 v_03;
  __m512 v_04;
  __m512 v_05;
  __m512 v_06;
  int iVar7;
  ulong uVar8;
  char cVar9;
  sbyte sVar10;
  _func_int **pp_Var11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  undefined1 (*pauVar17) [32];
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [64];
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  _func_int *p_Var25;
  int x_1;
  int iVar26;
  int iVar27;
  int x_2;
  ulong uVar28;
  int x;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [16];
  undefined1 (*pauVar31) [64];
  uint uVar32;
  undefined1 (*pauVar33) [32];
  undefined1 (*pauVar34) [16];
  undefined1 (*pauVar35) [64];
  long lVar36;
  long lVar37;
  int z;
  ulong uVar38;
  long lVar39;
  bool bVar40;
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar46;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined8 in_XMM1_Qa;
  __m128 v_07;
  __m128 v_08;
  __m128 v_09;
  __m128 v_10;
  Mat *pMVar47;
  Padding_x86_avx512 *pPVar48;
  Padding_x86_avx512 *pPVar49;
  float fVar50;
  undefined4 uVar51;
  undefined8 local_120;
  Mat m_1;
  Mat m;
  undefined8 local_78;
  
  p_Var25 = this->_vptr_Padding_x86_avx512[-3];
  uVar12 = *(uint *)(&this->field_0xd0 + (long)p_Var25);
  if ((((uVar12 == 0) && (*(int *)(&this->field_0xd4 + (long)p_Var25) == 0)) &&
      (*(int *)(&this->field_0xd8 + (long)p_Var25) == 0)) &&
     (((*(int *)(&this->field_0xdc + (long)p_Var25) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var25) == 0)) &&
      (*(int *)(&this->field_0xec + (long)p_Var25) == 0)))) {
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar7 = bottom_blob->w;
      iVar46 = bottom_blob->h;
      iVar26 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar7;
      top_blob->h = iVar46;
      top_blob->d = iVar26;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  m.elempack = bottom_blob->elempack;
  m.elemsize = bottom_blob->elemsize;
  if (m.elempack == 0) {
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    iVar7 = bottom_blob->d;
    iVar46 = bottom_blob->c;
    m.dims = bottom_blob->dims;
  }
  else {
    if (((int)m.elemsize * 8) / m.elempack == 8) {
      iVar7 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar7;
    }
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    iVar7 = bottom_blob->d;
    iVar46 = bottom_blob->c;
    m.dims = bottom_blob->dims;
    iVar26 = 4;
    fVar50 = 0.0;
    if (m.elempack == 4) {
      switch(m.dims) {
      case 1:
        uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var25) + m.w * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var25);
        sVar10 = 3;
        if ((uVar12 & 7) != 0) {
          sVar10 = ((uVar12 & 3) == 0) * '\x02';
        }
        m.dims = 1;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var25) & 3) == 0) && ((uVar12 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0)) {
          pMVar47 = top_blob;
          Mat::create(top_blob,(int)uVar12 >> 2,(m.elemsize >> 2) << sVar10,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar47->c * pMVar47->cstep != 0) {
            p_Var25 = this->_vptr_Padding_x86_avx512[-3];
            v_07[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var25);
            v_07[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var25);
            v_07[2] = (float)(int)in_XMM1_Qa;
            v_07[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      (bottom_blob,pMVar47,0,0,*(int *)(&this->field_0xd8 + (long)p_Var25) / 4,
                       *(int *)(&this->field_0xdc + (long)p_Var25) / 4,v_07);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar32 = uVar12 + m.h * 4 + *(int *)(&this->field_0xd4 + (long)p_Var25);
        sVar10 = 3;
        if ((uVar32 & 7) != 0) {
          sVar10 = ((uVar32 & 3) == 0) * '\x02';
        }
        m.dims = 2;
        if ((((uVar12 & 3) == 0) && ((uVar32 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0)) {
          pMVar47 = top_blob;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var25) +
                               *(int *)(&this->field_0xdc + (long)p_Var25),(int)uVar32 >> 2,
                      (m.elemsize >> 2) << sVar10,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar47->c * pMVar47->cstep != 0) {
            p_Var25 = this->_vptr_Padding_x86_avx512[-3];
            v_10[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var25);
            v_10[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var25);
            v_10[2] = (float)(int)in_XMM1_Qa;
            v_10[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      (bottom_blob,pMVar47,*(int *)(&this->field_0xd0 + (long)p_Var25) / 4,
                       *(int *)(&this->field_0xd4 + (long)p_Var25) / 4,
                       *(int *)(&this->field_0xd8 + (long)p_Var25),
                       *(int *)(&this->field_0xdc + (long)p_Var25),v_10);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar32 = *(uint *)(&this->field_0xe8 + (long)p_Var25) + iVar46 * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var25);
        sVar10 = ((uVar32 & 3) == 0) * '\x02';
        m.dims = 3;
        if ((uVar32 & 7) == 0) {
          sVar10 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var25) & 3) == 0) && ((uVar32 & 7) == 4)) {
          if ((uVar32 == iVar46 * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0)) {
            uVar32 = (int)uVar32 >> 2;
            pMVar47 = top_blob;
            Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var25) +
                                 *(int *)(&this->field_0xdc + (long)p_Var25),
                        uVar12 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var25),uVar32,
                        (m.elemsize >> 2) << sVar10,4,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar47->c * pMVar47->cstep != 0) {
              uVar38 = (long)*(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3])
                       / -4;
              if ((int)uVar32 < 1) {
                uVar32 = 0;
              }
              uVar28 = uVar38 & 0xffffffff;
              pPVar48 = this;
              for (uVar8 = 0; uVar8 != uVar32; uVar8 = uVar8 + 1) {
                m.w = pMVar47->w;
                m.h = pMVar47->h;
                m.elemsize = pMVar47->elemsize;
                pauVar34 = (undefined1 (*) [16])
                           (pMVar47->cstep * uVar8 * m.elemsize + (long)pMVar47->data);
                m.elempack = pMVar47->elempack;
                m.allocator = pMVar47->allocator;
                m.refcount = (int *)0x0;
                m.c = pMVar47->d;
                m.d = 1;
                m.dims = pMVar47->dims + -1;
                m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                          m.elemsize;
                if (pMVar47->dims == 4) {
                  m.cstep = (long)m.h * (long)m.w;
                }
                pp_Var11 = this->_vptr_Padding_x86_avx512;
                p_Var25 = pp_Var11[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var25) == 0) {
                  uVar51 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var25);
                  auVar42._4_4_ = uVar51;
                  auVar42._0_4_ = uVar51;
                  auVar42._8_4_ = uVar51;
                  auVar42._12_4_ = uVar51;
                }
                else {
                  auVar42 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0xf8 + (long)p_Var25) + uVar8 * 0x10);
                }
                uVar12 = (int)uVar38 + (int)uVar8;
                if ((int)uVar12 < 0 || iVar46 <= (int)uVar12) {
                  iVar7 = pMVar47->d * (int)m.cstep;
                  if (iVar7 < 1) {
                    iVar7 = 0;
                  }
                  while (iVar7 != 0) {
                    *pauVar34 = auVar42;
                    pauVar34 = pauVar34 + 1;
                    iVar7 = iVar7 + -1;
                  }
                }
                else {
                  m_1.w = bottom_blob->w;
                  m_1.h = bottom_blob->h;
                  m_1.c = bottom_blob->d;
                  pvVar5 = bottom_blob->data;
                  uVar13 = bottom_blob->elemsize;
                  sVar6 = bottom_blob->cstep;
                  pauVar18 = (undefined1 (*) [16])(uVar12 * sVar6 * uVar13 + (long)pvVar5);
                  m_1.elempack = bottom_blob->elempack;
                  m_1.allocator = bottom_blob->allocator;
                  m_1.refcount = (int *)0x0;
                  m_1.d = 1;
                  m_1.dims = bottom_blob->dims + -1;
                  m_1.cstep = (uVar13 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                              uVar13;
                  if (bottom_blob->dims == 4) {
                    m_1.cstep = (long)m_1.h * (long)m_1.w;
                  }
                  iVar7 = *(int *)(&pPVar48->field_0xe0 + (long)p_Var25);
                  this = pPVar48;
                  m_1.data = pauVar18;
                  m_1.elemsize = uVar13;
                  m.data = pauVar34;
                  if (iVar7 == 0) {
                    v_08._0_8_ = auVar42._0_8_;
                    v_08[2] = (float)(int)in_XMM1_Qa;
                    v_08[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    padding_constant_pack4_sse
                              (&m_1,&m,*(int *)(&pPVar48->field_0xd0 + (long)p_Var25),
                               *(int *)(&pPVar48->field_0xd4 + (long)p_Var25),
                               *(int *)(&pPVar48->field_0xd8 + (long)p_Var25),
                               *(int *)(&pPVar48->field_0xdc + (long)p_Var25),v_08);
                    pp_Var11 = pPVar48->_vptr_Padding_x86_avx512;
                    p_Var25 = pp_Var11[-3];
                    iVar7 = *(int *)(&pPVar48->field_0xe0 + (long)p_Var25);
                  }
                  if (iVar7 == 1) {
                    iVar26 = 0;
                    iVar7 = *(int *)(&this->field_0xd8 + (long)p_Var25);
                    if (*(int *)(&this->field_0xd8 + (long)p_Var25) < 1) {
                      iVar7 = 0;
                    }
                    iVar16 = *(int *)(&this->field_0xdc + (long)p_Var25);
                    if (*(int *)(&this->field_0xdc + (long)p_Var25) < 1) {
                      iVar16 = 0;
                    }
                    iVar27 = *(int *)(&this->field_0xd0 + (long)p_Var25);
                    if (*(int *)(&this->field_0xd0 + (long)p_Var25) < 1) {
                      iVar27 = iVar26;
                    }
                    iVar20 = *(int *)(&this->field_0xd4 + (long)p_Var25);
                    for (; iVar26 != iVar27; iVar26 = iVar26 + 1) {
                      auVar43 = *pauVar18;
                      iVar24 = iVar7;
                      while (bVar40 = iVar24 != 0, iVar24 = iVar24 + -1, bVar40) {
                        *pauVar34 = auVar43;
                        pauVar34 = pauVar34 + 1;
                      }
                      lVar36 = 0;
                      for (iVar24 = 0; iVar24 < m_1.w; iVar24 = iVar24 + 1) {
                        auVar43 = *(undefined1 (*) [16])
                                   ((long)pvVar5 + lVar36 + sVar6 * uVar13 * uVar28);
                        *(undefined1 (*) [16])(*pauVar34 + lVar36) = auVar43;
                        lVar36 = lVar36 + 0x10;
                      }
                      pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar36);
                      iVar24 = iVar16;
                      while (bVar40 = iVar24 != 0, iVar24 = iVar24 + -1, bVar40) {
                        *pauVar34 = auVar43;
                        pauVar34 = pauVar34 + 1;
                      }
                    }
                    for (iVar26 = 0; iVar26 < m_1.h; iVar26 = iVar26 + 1) {
                      auVar43 = *pauVar18;
                      iVar27 = iVar7;
                      while (bVar40 = iVar27 != 0, iVar27 = iVar27 + -1, bVar40) {
                        *pauVar34 = auVar43;
                        pauVar34 = pauVar34 + 1;
                      }
                      for (iVar27 = 0; iVar24 = iVar16, iVar27 < m_1.w; iVar27 = iVar27 + 1) {
                        auVar43 = *pauVar18;
                        *pauVar34 = auVar43;
                        pauVar18 = pauVar18 + 1;
                        pauVar34 = pauVar34 + 1;
                      }
                      while (iVar24 != 0) {
                        *pauVar34 = auVar43;
                        pauVar34 = pauVar34 + 1;
                        iVar24 = iVar24 + -1;
                      }
                    }
                    pauVar18 = (undefined1 (*) [16])((long)pauVar18 + (long)(m_1.w << 2) * -4);
                    iVar26 = 0;
                    if (iVar20 < 1) {
                      iVar20 = iVar26;
                    }
                    for (; iVar26 != iVar20; iVar26 = iVar26 + 1) {
                      auVar43 = *pauVar18;
                      iVar27 = iVar7;
                      while (bVar40 = iVar27 != 0, iVar27 = iVar27 + -1, bVar40) {
                        *pauVar34 = auVar43;
                        pauVar34 = pauVar34 + 1;
                      }
                      lVar36 = 0;
                      for (iVar27 = 0; iVar27 < m_1.w; iVar27 = iVar27 + 1) {
                        auVar43 = *(undefined1 (*) [16])(*pauVar18 + lVar36);
                        *(undefined1 (*) [16])(*pauVar34 + lVar36) = auVar43;
                        lVar36 = lVar36 + 0x10;
                      }
                      pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar36);
                      iVar27 = iVar16;
                      while (bVar40 = iVar27 != 0, iVar27 = iVar27 + -1, bVar40) {
                        *pauVar34 = auVar43;
                        pauVar34 = pauVar34 + 1;
                      }
                    }
                    p_Var25 = pp_Var11[-3];
                    iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var25);
                  }
                  lVar36 = -0x20;
                  if (iVar7 == 2) {
                    iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var25);
                    uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
                    pauVar34 = (undefined1 (*) [16])((long)(m_1.w * iVar7 * 4) * 4 + (long)m_1.data)
                    ;
                    uVar14 = 0;
                    uVar13 = 0;
                    if (0 < (int)uVar12) {
                      uVar13 = (ulong)uVar12;
                    }
                    uVar21 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var25);
                    if ((int)*(uint *)(&this->field_0xdc + (long)p_Var25) < 1) {
                      uVar21 = uVar14;
                    }
                    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var25);
                    if (iVar7 < 1) {
                      iVar7 = 0;
                    }
                    lVar15 = uVar13 * 0x10;
                    lVar23 = uVar21 * 0x10;
                    pauVar18 = (undefined1 (*) [16])m.data;
                    for (; (int)uVar14 != iVar7; uVar14 = (ulong)((int)uVar14 + 1)) {
                      lVar39 = 0;
                      for (lVar37 = 0; lVar15 + lVar37 != 0; lVar37 = lVar37 + -0x10) {
                        *(undefined1 (*) [16])(*pauVar18 + lVar39) =
                             *(undefined1 (*) [16])(pauVar34[(int)uVar12] + lVar37);
                        lVar39 = lVar39 + 0x10;
                      }
                      pauVar18 = (undefined1 (*) [16])((long)pauVar18 - lVar37);
                      pauVar30 = pauVar34;
                      for (iVar16 = 0; lVar37 = lVar36, iVar16 < m_1.w; iVar16 = iVar16 + 1) {
                        *pauVar18 = *pauVar30;
                        pauVar30 = pauVar30 + 1;
                        pauVar18 = pauVar18 + 1;
                      }
                      for (; lVar23 + lVar37 != -0x20; lVar37 = lVar37 + -0x10) {
                        *pauVar18 = *(undefined1 (*) [16])(*pauVar30 + lVar37);
                        pauVar18 = pauVar18 + 1;
                      }
                      pauVar34 = pauVar34 + -(long)m_1.w;
                    }
                    for (iVar7 = 0; iVar7 < m_1.h; iVar7 = iVar7 + 1) {
                      lVar39 = 0;
                      for (lVar37 = 0; lVar15 + lVar37 != 0; lVar37 = lVar37 + -0x10) {
                        *(undefined1 (*) [16])(*pauVar18 + lVar39) =
                             *(undefined1 (*) [16])(pauVar34[(int)uVar12] + lVar37);
                        lVar39 = lVar39 + 0x10;
                      }
                      pauVar18 = (undefined1 (*) [16])((long)pauVar18 - lVar37);
                      for (iVar16 = 0; lVar37 = lVar36, iVar16 < m_1.w; iVar16 = iVar16 + 1) {
                        *pauVar18 = *pauVar34;
                        pauVar34 = pauVar34 + 1;
                        pauVar18 = pauVar18 + 1;
                      }
                      for (; lVar23 + lVar37 != -0x20; lVar37 = lVar37 + -0x10) {
                        *pauVar18 = *(undefined1 (*) [16])(*pauVar34 + lVar37);
                        pauVar18 = pauVar18 + 1;
                      }
                    }
                    pauVar34 = pauVar34 + (long)m_1.w * -2;
                    iVar7 = 0;
                    if (iVar26 < 1) {
                      iVar26 = iVar7;
                    }
                    for (; iVar7 != iVar26; iVar7 = iVar7 + 1) {
                      lVar39 = 0;
                      for (lVar37 = 0; lVar15 + lVar37 != 0; lVar37 = lVar37 + -0x10) {
                        *(undefined1 (*) [16])(*pauVar18 + lVar39) =
                             *(undefined1 (*) [16])(pauVar34[(int)uVar12] + lVar37);
                        lVar39 = lVar39 + 0x10;
                      }
                      pauVar18 = (undefined1 (*) [16])((long)pauVar18 - lVar37);
                      pauVar30 = pauVar34;
                      for (iVar16 = 0; lVar37 = lVar36, iVar16 < m_1.w; iVar16 = iVar16 + 1) {
                        *pauVar18 = *pauVar30;
                        pauVar30 = pauVar30 + 1;
                        pauVar18 = pauVar18 + 1;
                      }
                      for (; lVar23 + lVar37 != -0x20; lVar37 = lVar37 + -0x10) {
                        *pauVar18 = *(undefined1 (*) [16])(*pauVar30 + lVar37);
                        pauVar18 = pauVar18 + 1;
                      }
                      pauVar34 = pauVar34 + -(long)m_1.w;
                    }
                  }
                  pPVar48 = this;
                  if (m_1.refcount != (int *)0x0) {
                    LOCK();
                    *m_1.refcount = *m_1.refcount + -1;
                    UNLOCK();
                    if (*m_1.refcount == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        free(m_1.data);
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if (m.refcount != (int *)0x0) {
                    LOCK();
                    *m.refcount = *m.refcount + -1;
                    UNLOCK();
                    if (*m.refcount == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        free(m.data);
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar28 = (ulong)((int)uVar28 + 1);
              }
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        m.dims = iVar26;
        if (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0) {
          uVar32 = *(int *)(&this->field_0xe8 + (long)p_Var25) + iVar7 +
                   *(int *)(&this->field_0xec + (long)p_Var25);
          pMVar47 = top_blob;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var25) +
                               *(int *)(&this->field_0xdc + (long)p_Var25),
                      uVar12 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var25),uVar32,iVar46,
                      m.elemsize,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar47->c * pMVar47->cstep != 0) {
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            if (iVar46 < 1) {
              iVar46 = 0;
            }
            uVar51 = 0;
            pPVar48 = this;
            for (lVar36 = 0; lVar36 != CONCAT44(uVar51,iVar46); lVar36 = lVar36 + 1) {
              p_Var25 = this->_vptr_Padding_x86_avx512[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var25) == 0) {
                uVar1 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var25);
                auVar43._4_4_ = uVar1;
                auVar43._0_4_ = uVar1;
                auVar43._8_4_ = uVar1;
                auVar43._12_4_ = uVar1;
              }
              else {
                auVar43 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0xf8 + (long)p_Var25) + lVar36 * 0x10);
              }
              for (uVar38 = 0; uVar38 != uVar32; uVar38 = uVar38 + 1) {
                m.w = pMVar47->w;
                m.h = pMVar47->h;
                m.elemsize = pMVar47->elemsize;
                m.elempack = pMVar47->elempack;
                m.allocator = pMVar47->allocator;
                m.cstep = (long)m.h * (long)m.w;
                m.data = (void *)((long)pMVar47->data +
                                 uVar38 * m.elemsize * m.cstep +
                                 pMVar47->cstep * lVar36 * m.elemsize);
                m.refcount = (int *)0x0;
                m.dims = 2;
                m.d = 1;
                m.c = 1;
                p_Var25 = this->_vptr_Padding_x86_avx512[-3];
                uVar12 = (int)uVar38 - *(int *)(&this->field_0xe8 + (long)p_Var25);
                if ((int)uVar12 < 0 || iVar7 <= (int)uVar12) {
                  uVar8 = m.cstep & 0xffffffff;
                  if ((int)m.cstep < 1) {
                    uVar8 = 0;
                  }
                  while (iVar26 = (int)uVar8, uVar8 = (ulong)(iVar26 - 1), iVar26 != 0) {
                    *(undefined1 (*) [16])m.data = auVar43;
                    m.data = (void *)((long)m.data + 0x10);
                  }
                }
                else {
                  m_1.w = bottom_blob->w;
                  m_1.h = bottom_blob->h;
                  m_1.elemsize = bottom_blob->elemsize;
                  m_1.elempack = bottom_blob->elempack;
                  m_1.allocator = bottom_blob->allocator;
                  m_1.cstep = (long)m_1.h * (long)m_1.w;
                  m_1.data = (void *)((long)bottom_blob->data +
                                     m_1.cstep * m_1.elemsize * (ulong)uVar12 +
                                     bottom_blob->cstep * lVar36 * m_1.elemsize);
                  m_1.refcount = (int *)0x0;
                  m_1.dims = 2;
                  m_1.d = 1;
                  m_1.c = 1;
                  local_78 = auVar43._0_8_;
                  v_09[2] = (float)(int)in_XMM1_Qa;
                  v_09[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                  v_09[0] = (float)(undefined4)local_78;
                  v_09[1] = (float)local_78._4_4_;
                  pPVar49 = pPVar48;
                  padding_constant_pack4_sse
                            (&m_1,&m,*(int *)(&pPVar48->field_0xd0 + (long)p_Var25),
                             *(int *)(&pPVar48->field_0xd4 + (long)p_Var25),
                             *(int *)(&pPVar48->field_0xd8 + (long)p_Var25),
                             *(int *)(&pPVar48->field_0xdc + (long)p_Var25),v_09);
                  this = pPVar48;
                  pPVar48 = pPVar49;
                }
              }
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (m.elempack == 8) {
      switch(m.dims) {
      case 1:
        uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var25) + m.w * 8 +
                 *(int *)(&this->field_0xdc + (long)p_Var25);
        sVar10 = 3;
        if ((uVar12 & 7) != 0) {
          sVar10 = ((uVar12 & 3) == 0) * '\x02';
        }
        m.dims = 1;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var25) | uVar12) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0)) {
          pMVar47 = top_blob;
          Mat::create(top_blob,(int)uVar12 / 8,(m.elemsize >> 3) << sVar10,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar47->c * pMVar47->cstep != 0) {
            v._8_8_ = pMVar47;
            v._0_8_ = bottom_blob;
            v._16_8_ = this;
            v[6] = (float)iVar46;
            v[7] = fVar50;
            padding_constant_pack8_avx
                      (bottom_blob,pMVar47,0,0,
                       *(int *)(&this->field_0xd8 + (long)this->_vptr_Padding_x86_avx512[-3]) / 8,
                       *(int *)(&this->field_0xdc + (long)this->_vptr_Padding_x86_avx512[-3]) / 8,v)
            ;
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar32 = uVar12 + m.h * 8 + *(int *)(&this->field_0xd4 + (long)p_Var25);
        sVar10 = 3;
        if ((uVar32 & 7) != 0) {
          sVar10 = ((uVar32 & 3) == 0) * '\x02';
        }
        m.dims = 2;
        if ((((uVar12 | uVar32) & 7) == 0) && (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0)) {
          pMVar47 = top_blob;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var25) +
                               *(int *)(&this->field_0xdc + (long)p_Var25),(int)uVar32 / 8,
                      (m.elemsize >> 3) << sVar10,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar47->c * pMVar47->cstep != 0) {
            p_Var25 = this->_vptr_Padding_x86_avx512[-3];
            v_02._8_8_ = pMVar47;
            v_02._0_8_ = bottom_blob;
            v_02._16_8_ = this;
            v_02[6] = (float)iVar46;
            v_02[7] = fVar50;
            padding_constant_pack8_avx
                      (bottom_blob,pMVar47,*(int *)(&this->field_0xd0 + (long)p_Var25) / 8,
                       *(int *)(&this->field_0xd4 + (long)p_Var25) / 8,
                       *(int *)(&this->field_0xd8 + (long)p_Var25),
                       *(int *)(&this->field_0xdc + (long)p_Var25),v_02);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar32 = *(uint *)(&this->field_0xe8 + (long)p_Var25) + iVar46 * 8 +
                 *(int *)(&this->field_0xec + (long)p_Var25);
        sVar10 = ((uVar32 & 3) == 0) * '\x02';
        m.dims = 3;
        if ((uVar32 & 7) == 0) {
          sVar10 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var25) | uVar32) & 7) == 0) {
          if ((uVar32 == iVar46 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0)) {
            uVar38 = (long)(int)uVar32 / 8 & 0xffffffff;
            iVar7 = (int)((long)(int)uVar32 / 8);
            pMVar47 = top_blob;
            Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var25) +
                                 *(int *)(&this->field_0xdc + (long)p_Var25),
                        uVar12 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var25),iVar7,
                        (m.elemsize >> 3) << sVar10,8,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar47->c * pMVar47->cstep != 0) {
              uVar8 = (long)*(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]) /
                      -8;
              if (iVar7 < 1) {
                uVar38 = 0;
              }
              uVar13 = uVar8 & 0xffffffff;
              pPVar48 = this;
              for (uVar28 = 0; uVar28 != uVar38; uVar28 = uVar28 + 1) {
                m.w = pMVar47->w;
                m.h = pMVar47->h;
                m.elemsize = pMVar47->elemsize;
                pauVar33 = (undefined1 (*) [32])
                           (pMVar47->cstep * uVar28 * m.elemsize + (long)pMVar47->data);
                m.elempack = pMVar47->elempack;
                m.allocator = pMVar47->allocator;
                m.refcount = (int *)0x0;
                m.c = pMVar47->d;
                m.d = 1;
                m.dims = pMVar47->dims + -1;
                m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                          m.elemsize;
                if (pMVar47->dims == 4) {
                  m.cstep = (long)m.h * (long)m.w;
                }
                pp_Var11 = this->_vptr_Padding_x86_avx512;
                p_Var25 = pp_Var11[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var25) == 0) {
                  uVar51 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var25);
                  auVar44._4_4_ = uVar51;
                  auVar44._0_4_ = uVar51;
                  auVar44._8_4_ = uVar51;
                  auVar44._12_4_ = uVar51;
                  auVar44._16_4_ = uVar51;
                  auVar44._20_4_ = uVar51;
                  auVar44._24_4_ = uVar51;
                  auVar44._28_4_ = uVar51;
                }
                else {
                  auVar44 = *(undefined1 (*) [32])
                             (*(long *)(&this->field_0xf8 + (long)p_Var25) + uVar28 * 0x20);
                }
                uVar12 = (int)uVar8 + (int)uVar28;
                if ((int)uVar12 < 0 || iVar46 <= (int)uVar12) {
                  iVar7 = pMVar47->d * (int)m.cstep;
                  if (iVar7 < 1) {
                    iVar7 = 0;
                  }
                  while (iVar7 != 0) {
                    *pauVar33 = auVar44;
                    pauVar33 = pauVar33 + 1;
                    iVar7 = iVar7 + -1;
                  }
                }
                else {
                  m_1.w = bottom_blob->w;
                  m_1.h = bottom_blob->h;
                  m_1.c = bottom_blob->d;
                  pvVar5 = bottom_blob->data;
                  uVar14 = bottom_blob->elemsize;
                  sVar6 = bottom_blob->cstep;
                  pauVar17 = (undefined1 (*) [32])(uVar12 * sVar6 * uVar14 + (long)pvVar5);
                  m_1.elempack = bottom_blob->elempack;
                  m_1.allocator = bottom_blob->allocator;
                  m_1.refcount = (int *)0x0;
                  m_1.d = 1;
                  m_1.dims = bottom_blob->dims + -1;
                  m_1.cstep = (uVar14 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                              uVar14;
                  if (bottom_blob->dims == 4) {
                    m_1.cstep = (long)m_1.h * (long)m_1.w;
                  }
                  iVar7 = *(int *)(&pPVar48->field_0xe0 + (long)p_Var25);
                  this = pPVar48;
                  m_1.data = pauVar17;
                  m_1.elemsize = uVar14;
                  m.data = pauVar33;
                  if (iVar7 == 0) {
                    v_00._8_8_ = pMVar47;
                    v_00._0_8_ = bottom_blob;
                    v_00._16_8_ = pPVar48;
                    v_00[6] = (float)iVar46;
                    v_00[7] = fVar50;
                    padding_constant_pack8_avx
                              (&m_1,&m,*(int *)(&pPVar48->field_0xd0 + (long)p_Var25),
                               *(int *)(&pPVar48->field_0xd4 + (long)p_Var25),
                               *(int *)(&pPVar48->field_0xd8 + (long)p_Var25),
                               *(int *)(&pPVar48->field_0xdc + (long)p_Var25),v_00);
                    pp_Var11 = pPVar48->_vptr_Padding_x86_avx512;
                    p_Var25 = pp_Var11[-3];
                    iVar7 = *(int *)(&pPVar48->field_0xe0 + (long)p_Var25);
                  }
                  if (iVar7 == 1) {
                    iVar26 = 0;
                    iVar7 = *(int *)(&this->field_0xd8 + (long)p_Var25);
                    if (*(int *)(&this->field_0xd8 + (long)p_Var25) < 1) {
                      iVar7 = 0;
                    }
                    iVar16 = *(int *)(&this->field_0xdc + (long)p_Var25);
                    if (*(int *)(&this->field_0xdc + (long)p_Var25) < 1) {
                      iVar16 = 0;
                    }
                    iVar27 = *(int *)(&this->field_0xd0 + (long)p_Var25);
                    if (*(int *)(&this->field_0xd0 + (long)p_Var25) < 1) {
                      iVar27 = iVar26;
                    }
                    iVar20 = *(int *)(&this->field_0xd4 + (long)p_Var25);
                    for (; iVar26 != iVar27; iVar26 = iVar26 + 1) {
                      auVar45 = *pauVar17;
                      iVar24 = iVar7;
                      while (bVar40 = iVar24 != 0, iVar24 = iVar24 + -1, bVar40) {
                        *pauVar33 = auVar45;
                        pauVar33 = pauVar33 + 1;
                      }
                      lVar36 = 0;
                      for (iVar24 = 0; iVar24 < m_1.w; iVar24 = iVar24 + 1) {
                        auVar45 = *(undefined1 (*) [32])
                                   ((long)pvVar5 + lVar36 + sVar6 * uVar14 * uVar13);
                        *(undefined1 (*) [32])(*pauVar33 + lVar36) = auVar45;
                        lVar36 = lVar36 + 0x20;
                      }
                      pauVar33 = (undefined1 (*) [32])(*pauVar33 + lVar36);
                      iVar24 = iVar16;
                      while (bVar40 = iVar24 != 0, iVar24 = iVar24 + -1, bVar40) {
                        *pauVar33 = auVar45;
                        pauVar33 = pauVar33 + 1;
                      }
                    }
                    for (iVar26 = 0; iVar26 < m_1.h; iVar26 = iVar26 + 1) {
                      auVar45 = *pauVar17;
                      iVar27 = iVar7;
                      while (bVar40 = iVar27 != 0, iVar27 = iVar27 + -1, bVar40) {
                        *pauVar33 = auVar45;
                        pauVar33 = pauVar33 + 1;
                      }
                      for (iVar27 = 0; iVar24 = iVar16, iVar27 < m_1.w; iVar27 = iVar27 + 1) {
                        auVar45 = *pauVar17;
                        *pauVar33 = auVar45;
                        pauVar17 = pauVar17 + 1;
                        pauVar33 = pauVar33 + 1;
                      }
                      while (iVar24 != 0) {
                        *pauVar33 = auVar45;
                        pauVar33 = pauVar33 + 1;
                        iVar24 = iVar24 + -1;
                      }
                    }
                    pauVar17 = (undefined1 (*) [32])((long)pauVar17 + (long)(m_1.w << 3) * -4);
                    iVar26 = 0;
                    if (iVar20 < 1) {
                      iVar20 = iVar26;
                    }
                    for (; iVar26 != iVar20; iVar26 = iVar26 + 1) {
                      auVar45 = *pauVar17;
                      iVar27 = iVar7;
                      while (bVar40 = iVar27 != 0, iVar27 = iVar27 + -1, bVar40) {
                        *pauVar33 = auVar45;
                        pauVar33 = pauVar33 + 1;
                      }
                      lVar36 = 0;
                      for (iVar27 = 0; iVar27 < m_1.w; iVar27 = iVar27 + 1) {
                        auVar45 = *(undefined1 (*) [32])(*pauVar17 + lVar36);
                        *(undefined1 (*) [32])(*pauVar33 + lVar36) = auVar45;
                        lVar36 = lVar36 + 0x20;
                      }
                      pauVar33 = (undefined1 (*) [32])(*pauVar33 + lVar36);
                      iVar27 = iVar16;
                      while (bVar40 = iVar27 != 0, iVar27 = iVar27 + -1, bVar40) {
                        *pauVar33 = auVar45;
                        pauVar33 = pauVar33 + 1;
                      }
                    }
                    p_Var25 = pp_Var11[-3];
                    iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var25);
                  }
                  lVar36 = -0x40;
                  if (iVar7 == 2) {
                    iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var25);
                    uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
                    pauVar33 = (undefined1 (*) [32])((long)(m_1.w * iVar7 * 8) * 4 + (long)m_1.data)
                    ;
                    uVar21 = 0;
                    uVar14 = 0;
                    if (0 < (int)uVar12) {
                      uVar14 = (ulong)uVar12;
                    }
                    uVar22 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var25);
                    if ((int)*(uint *)(&this->field_0xdc + (long)p_Var25) < 1) {
                      uVar22 = uVar21;
                    }
                    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var25);
                    if (iVar7 < 1) {
                      iVar7 = 0;
                    }
                    lVar15 = uVar14 * 0x20;
                    lVar23 = uVar22 * 0x20;
                    pauVar17 = (undefined1 (*) [32])m.data;
                    for (; (int)uVar21 != iVar7; uVar21 = (ulong)((int)uVar21 + 1)) {
                      lVar39 = 0;
                      for (lVar37 = 0; lVar15 + lVar37 != 0; lVar37 = lVar37 + -0x20) {
                        *(undefined1 (*) [32])(*pauVar17 + lVar39) =
                             *(undefined1 (*) [32])(pauVar33[(int)uVar12] + lVar37);
                        lVar39 = lVar39 + 0x20;
                      }
                      pauVar17 = (undefined1 (*) [32])((long)pauVar17 - lVar37);
                      pauVar29 = pauVar33;
                      for (iVar16 = 0; lVar37 = lVar36, iVar16 < m_1.w; iVar16 = iVar16 + 1) {
                        *pauVar17 = *pauVar29;
                        pauVar29 = pauVar29 + 1;
                        pauVar17 = pauVar17 + 1;
                      }
                      for (; lVar23 + lVar37 != -0x40; lVar37 = lVar37 + -0x20) {
                        *pauVar17 = *(undefined1 (*) [32])(*pauVar29 + lVar37);
                        pauVar17 = pauVar17 + 1;
                      }
                      pauVar33 = pauVar33 + -(long)m_1.w;
                    }
                    for (iVar7 = 0; iVar7 < m_1.h; iVar7 = iVar7 + 1) {
                      lVar39 = 0;
                      for (lVar37 = 0; lVar15 + lVar37 != 0; lVar37 = lVar37 + -0x20) {
                        *(undefined1 (*) [32])(*pauVar17 + lVar39) =
                             *(undefined1 (*) [32])(pauVar33[(int)uVar12] + lVar37);
                        lVar39 = lVar39 + 0x20;
                      }
                      pauVar17 = (undefined1 (*) [32])((long)pauVar17 - lVar37);
                      for (iVar16 = 0; lVar37 = lVar36, iVar16 < m_1.w; iVar16 = iVar16 + 1) {
                        *pauVar17 = *pauVar33;
                        pauVar33 = pauVar33 + 1;
                        pauVar17 = pauVar17 + 1;
                      }
                      for (; lVar23 + lVar37 != -0x40; lVar37 = lVar37 + -0x20) {
                        *pauVar17 = *(undefined1 (*) [32])(*pauVar33 + lVar37);
                        pauVar17 = pauVar17 + 1;
                      }
                    }
                    pauVar33 = pauVar33 + (long)m_1.w * -2;
                    iVar7 = 0;
                    if (iVar26 < 1) {
                      iVar26 = iVar7;
                    }
                    for (; iVar7 != iVar26; iVar7 = iVar7 + 1) {
                      lVar39 = 0;
                      for (lVar37 = 0; lVar15 + lVar37 != 0; lVar37 = lVar37 + -0x20) {
                        *(undefined1 (*) [32])(*pauVar17 + lVar39) =
                             *(undefined1 (*) [32])(pauVar33[(int)uVar12] + lVar37);
                        lVar39 = lVar39 + 0x20;
                      }
                      pauVar17 = (undefined1 (*) [32])((long)pauVar17 - lVar37);
                      pauVar29 = pauVar33;
                      for (iVar16 = 0; lVar37 = lVar36, iVar16 < m_1.w; iVar16 = iVar16 + 1) {
                        *pauVar17 = *pauVar29;
                        pauVar29 = pauVar29 + 1;
                        pauVar17 = pauVar17 + 1;
                      }
                      for (; lVar23 + lVar37 != -0x40; lVar37 = lVar37 + -0x20) {
                        *pauVar17 = *(undefined1 (*) [32])(*pauVar29 + lVar37);
                        pauVar17 = pauVar17 + 1;
                      }
                      pauVar33 = pauVar33 + -(long)m_1.w;
                    }
                  }
                  pPVar48 = this;
                  if (m_1.refcount != (int *)0x0) {
                    LOCK();
                    *m_1.refcount = *m_1.refcount + -1;
                    UNLOCK();
                    if (*m_1.refcount == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        free(m_1.data);
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if (m.refcount != (int *)0x0) {
                    LOCK();
                    *m.refcount = *m.refcount + -1;
                    UNLOCK();
                    if (*m.refcount == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        free(m.data);
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar13 = (ulong)((int)uVar13 + 1);
              }
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        m.dims = iVar26;
        if (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0) {
          uVar32 = *(int *)(&this->field_0xe8 + (long)p_Var25) + iVar7 +
                   *(int *)(&this->field_0xec + (long)p_Var25);
          pMVar47 = top_blob;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var25) +
                               *(int *)(&this->field_0xdc + (long)p_Var25),
                      uVar12 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var25),uVar32,iVar46,
                      m.elemsize,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar47->c * pMVar47->cstep != 0) {
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            if (iVar46 < 1) {
              iVar46 = 0;
            }
            fVar50 = 0.0;
            pPVar48 = this;
            for (lVar36 = 0; lVar36 != CONCAT44(fVar50,iVar46); lVar36 = lVar36 + 1) {
              p_Var25 = this->_vptr_Padding_x86_avx512[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var25) == 0) {
                uVar51 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var25);
                auVar45._4_4_ = uVar51;
                auVar45._0_4_ = uVar51;
                auVar45._8_4_ = uVar51;
                auVar45._12_4_ = uVar51;
                auVar45._16_4_ = uVar51;
                auVar45._20_4_ = uVar51;
                auVar45._24_4_ = uVar51;
                auVar45._28_4_ = uVar51;
              }
              else {
                auVar45 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0xf8 + (long)p_Var25) + lVar36 * 0x20);
              }
              for (uVar38 = 0; uVar38 != uVar32; uVar38 = uVar38 + 1) {
                m.w = pMVar47->w;
                m.h = pMVar47->h;
                m.elemsize = pMVar47->elemsize;
                m.elempack = pMVar47->elempack;
                m.allocator = pMVar47->allocator;
                m.cstep = (long)m.h * (long)m.w;
                m.data = (void *)((long)pMVar47->data +
                                 uVar38 * m.elemsize * m.cstep +
                                 pMVar47->cstep * lVar36 * m.elemsize);
                m.refcount = (int *)0x0;
                m.dims = 2;
                m.d = 1;
                m.c = 1;
                p_Var25 = this->_vptr_Padding_x86_avx512[-3];
                uVar12 = (int)uVar38 - *(int *)(&this->field_0xe8 + (long)p_Var25);
                if ((int)uVar12 < 0 || iVar7 <= (int)uVar12) {
                  uVar8 = m.cstep & 0xffffffff;
                  if ((int)m.cstep < 1) {
                    uVar8 = 0;
                  }
                  while (iVar26 = (int)uVar8, uVar8 = (ulong)(iVar26 - 1), iVar26 != 0) {
                    *(undefined1 (*) [32])m.data = auVar45;
                    m.data = (void *)((long)m.data + 0x20);
                  }
                }
                else {
                  m_1.w = bottom_blob->w;
                  m_1.h = bottom_blob->h;
                  m_1.elemsize = bottom_blob->elemsize;
                  m_1.elempack = bottom_blob->elempack;
                  m_1.allocator = bottom_blob->allocator;
                  m_1.cstep = (long)m_1.h * (long)m_1.w;
                  m_1.data = (void *)((long)bottom_blob->data +
                                     m_1.cstep * m_1.elemsize * (ulong)uVar12 +
                                     bottom_blob->cstep * lVar36 * m_1.elemsize);
                  m_1.refcount = (int *)0x0;
                  m_1.dims = 2;
                  m_1.d = 1;
                  m_1.c = 1;
                  v_01._8_8_ = pMVar47;
                  v_01._0_8_ = bottom_blob;
                  v_01._16_8_ = pPVar48;
                  v_01[6] = (float)iVar46;
                  v_01[7] = fVar50;
                  pPVar49 = pPVar48;
                  padding_constant_pack8_avx
                            (&m_1,&m,*(int *)(&pPVar48->field_0xd0 + (long)p_Var25),
                             *(int *)(&pPVar48->field_0xd4 + (long)p_Var25),
                             *(int *)(&pPVar48->field_0xd8 + (long)p_Var25),
                             *(int *)(&pPVar48->field_0xdc + (long)p_Var25),v_01);
                  this = pPVar48;
                  pPVar48 = pPVar49;
                }
              }
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (m.elempack == 0x10) {
      switch(m.dims) {
      case 1:
        uVar12 = m.w * 0x10 + *(uint *)(&this->field_0xd8 + (long)p_Var25) +
                 *(int *)(&this->field_0xdc + (long)p_Var25);
        if ((uVar12 & 0xf) == 0) {
          cVar9 = '\x10';
        }
        else if ((uVar12 & 7) == 0) {
          cVar9 = '\b';
        }
        else {
          cVar9 = ((uVar12 & 3) == 0) * '\x03' + '\x01';
        }
        m.dims = 1;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var25) & 0xf) == 0) && (cVar9 == '\x10')) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0)) {
          pMVar47 = top_blob;
          Mat::create(top_blob,(int)uVar12 / 0x10,m.elemsize & 0xfffffffffffffff0,0x10,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar47->c * pMVar47->cstep != 0) {
            p_Var25 = this->_vptr_Padding_x86_avx512[-3];
            vpbroadcastd_avx512f(ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var25)));
            v_05._8_8_ = pMVar47;
            v_05._0_8_ = bottom_blob;
            v_05._16_8_ = this;
            v_05[6] = (float)iVar46;
            v_05[7] = fVar50;
            v_05[8] = 0.0;
            v_05[9] = 0.0;
            v_05._40_8_ = local_120;
            v_05._48_8_ = m_1.data;
            v_05._56_8_ = m_1.refcount;
            padding_constant_pack16_avx512
                      (bottom_blob,pMVar47,0,0,*(int *)(&this->field_0xd8 + (long)p_Var25) / 0x10,
                       *(int *)(&this->field_0xdc + (long)p_Var25) / 0x10,v_05);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar32 = m.h * 0x10 + uVar12 + *(int *)(&this->field_0xd4 + (long)p_Var25);
        if ((uVar32 & 0xf) == 0) {
          cVar9 = '\x10';
        }
        else if ((uVar32 & 7) == 0) {
          cVar9 = '\b';
        }
        else {
          cVar9 = ((uVar32 & 3) == 0) * '\x03' + '\x01';
        }
        m.dims = 2;
        if ((((uVar12 & 0xf) == 0) && (cVar9 == '\x10')) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0)) {
          pMVar47 = top_blob;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var25) +
                               *(int *)(&this->field_0xdc + (long)p_Var25),(int)uVar32 / 0x10,
                      m.elemsize & 0xfffffffffffffff0,0x10,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar47->c * pMVar47->cstep != 0) {
            p_Var25 = this->_vptr_Padding_x86_avx512[-3];
            vpbroadcastd_avx512f(ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var25)));
            v_06._8_8_ = pMVar47;
            v_06._0_8_ = bottom_blob;
            v_06._16_8_ = this;
            v_06[6] = (float)iVar46;
            v_06[7] = fVar50;
            v_06[8] = -NAN;
            v_06[9] = -NAN;
            v_06._40_8_ = local_120;
            v_06._48_8_ = m_1.data;
            v_06._56_8_ = m_1.refcount;
            padding_constant_pack16_avx512
                      (bottom_blob,pMVar47,*(int *)(&this->field_0xd0 + (long)p_Var25) / 0x10,
                       *(int *)(&this->field_0xd4 + (long)p_Var25) / 0x10,
                       *(int *)(&this->field_0xd8 + (long)p_Var25),
                       *(int *)(&this->field_0xdc + (long)p_Var25),v_06);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar32 = *(uint *)(&this->field_0xe8 + (long)p_Var25) + iVar46 * 0x10 +
                 *(int *)(&this->field_0xec + (long)p_Var25);
        if ((uVar32 & 0xf) == 0) {
          cVar9 = '\x10';
        }
        else if ((uVar32 & 7) == 0) {
          cVar9 = '\b';
        }
        else {
          cVar9 = ((uVar32 & 3) == 0) * '\x03' + '\x01';
        }
        m.dims = 3;
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var25) & 0xf) == 0) && (cVar9 == '\x10')) {
          if ((uVar32 == iVar46 * 0x10) || (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0)) {
            uVar38 = (long)(int)uVar32 / 0x10 & 0xffffffff;
            iVar7 = (int)((long)(int)uVar32 / 0x10);
            pMVar47 = top_blob;
            Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var25) +
                                 *(int *)(&this->field_0xdc + (long)p_Var25),
                        uVar12 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var25),iVar7,
                        m.elemsize & 0xfffffffffffffff0,0x10,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar47->c * pMVar47->cstep != 0) {
              uVar8 = (long)*(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]) /
                      -0x10;
              if (iVar7 < 1) {
                uVar38 = 0;
              }
              uVar13 = uVar8 & 0xffffffff;
              pPVar48 = this;
              for (uVar28 = 0; uVar28 != uVar38; uVar28 = uVar28 + 1) {
                m.w = pMVar47->w;
                m.h = pMVar47->h;
                m.elemsize = pMVar47->elemsize;
                pauVar35 = (undefined1 (*) [64])
                           (pMVar47->cstep * uVar28 * m.elemsize + (long)pMVar47->data);
                m.elempack = pMVar47->elempack;
                m.allocator = pMVar47->allocator;
                m.refcount = (int *)0x0;
                m.c = pMVar47->d;
                m.d = 1;
                m.dims = pMVar47->dims + -1;
                m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                          m.elemsize;
                if (pMVar47->dims == 4) {
                  m.cstep = (long)m.h * (long)m.w;
                }
                pp_Var11 = this->_vptr_Padding_x86_avx512;
                p_Var25 = pp_Var11[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var25) == 0) {
                  auVar41 = vpbroadcastd_avx512f
                                      (ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var25)));
                }
                else {
                  auVar41 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                               (*(long *)(&this->field_0xf8 + (long)p_Var25) +
                                               uVar28 * 0x40));
                }
                uVar12 = (int)uVar8 + (int)uVar28;
                if ((int)uVar12 < 0 || iVar46 <= (int)uVar12) {
                  iVar7 = pMVar47->d * (int)m.cstep;
                  if (iVar7 < 1) {
                    iVar7 = 0;
                  }
                  while (iVar7 != 0) {
                    auVar2 = vmovdqu64_avx512f(auVar41);
                    *pauVar35 = auVar2;
                    pauVar35 = pauVar35 + 1;
                    iVar7 = iVar7 + -1;
                  }
                }
                else {
                  m_1.w = bottom_blob->w;
                  m_1.h = bottom_blob->h;
                  m_1.c = bottom_blob->d;
                  pvVar5 = bottom_blob->data;
                  uVar14 = bottom_blob->elemsize;
                  sVar6 = bottom_blob->cstep;
                  pauVar19 = (undefined1 (*) [64])(uVar12 * sVar6 * uVar14 + (long)pvVar5);
                  m_1.elempack = bottom_blob->elempack;
                  m_1.allocator = bottom_blob->allocator;
                  m_1.refcount = (int *)0x0;
                  m_1.d = 1;
                  m_1.dims = bottom_blob->dims + -1;
                  m_1.cstep = (uVar14 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                              uVar14;
                  if (bottom_blob->dims == 4) {
                    m_1.cstep = (long)m_1.h * (long)m_1.w;
                  }
                  iVar7 = *(int *)(&pPVar48->field_0xe0 + (long)p_Var25);
                  this = pPVar48;
                  m_1.data = pauVar19;
                  m_1.elemsize = uVar14;
                  m.data = pauVar35;
                  if (iVar7 == 0) {
                    v_04._8_8_ = pMVar47;
                    v_04._0_8_ = bottom_blob;
                    v_04._16_8_ = pPVar48;
                    v_04[6] = (float)iVar46;
                    v_04[7] = fVar50;
                    v_04[8] = 0.0;
                    v_04[9] = 0.0;
                    v_04[10] = (float)(int)uVar13;
                    v_04[0xb] = (float)(int)(uVar13 >> 0x20);
                    v_04._48_8_ = pauVar19;
                    v_04[0xe] = 0.0;
                    v_04[0xf] = 0.0;
                    padding_constant_pack16_avx512
                              (&m_1,&m,*(int *)(&pPVar48->field_0xd0 + (long)p_Var25),
                               *(int *)(&pPVar48->field_0xd4 + (long)p_Var25),
                               *(int *)(&pPVar48->field_0xd8 + (long)p_Var25),
                               *(int *)(&pPVar48->field_0xdc + (long)p_Var25),v_04);
                    pp_Var11 = pPVar48->_vptr_Padding_x86_avx512;
                    p_Var25 = pp_Var11[-3];
                    iVar7 = *(int *)(&pPVar48->field_0xe0 + (long)p_Var25);
                  }
                  if (iVar7 == 1) {
                    iVar26 = 0;
                    iVar7 = *(int *)(&this->field_0xd8 + (long)p_Var25);
                    if (*(int *)(&this->field_0xd8 + (long)p_Var25) < 1) {
                      iVar7 = 0;
                    }
                    iVar16 = *(int *)(&this->field_0xdc + (long)p_Var25);
                    if (*(int *)(&this->field_0xdc + (long)p_Var25) < 1) {
                      iVar16 = 0;
                    }
                    iVar27 = *(int *)(&this->field_0xd0 + (long)p_Var25);
                    if (*(int *)(&this->field_0xd0 + (long)p_Var25) < 1) {
                      iVar27 = iVar26;
                    }
                    iVar20 = *(int *)(&this->field_0xd4 + (long)p_Var25);
                    for (; iVar26 != iVar27; iVar26 = iVar26 + 1) {
                      auVar41 = vmovdqa64_avx512f(*pauVar19);
                      iVar24 = iVar7;
                      while (bVar40 = iVar24 != 0, iVar24 = iVar24 + -1, bVar40) {
                        auVar2 = vmovdqa64_avx512f(auVar41);
                        *pauVar35 = auVar2;
                        pauVar35 = pauVar35 + 1;
                      }
                      lVar36 = 0;
                      for (iVar24 = 0; iVar24 < m_1.w; iVar24 = iVar24 + 1) {
                        auVar41 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                     ((long)pvVar5 +
                                                     lVar36 + sVar6 * uVar14 * uVar13));
                        auVar2 = vmovdqa64_avx512f(auVar41);
                        *(undefined1 (*) [64])(*pauVar35 + lVar36) = auVar2;
                        lVar36 = lVar36 + 0x40;
                      }
                      pauVar35 = (undefined1 (*) [64])(*pauVar35 + lVar36);
                      iVar24 = iVar16;
                      while (bVar40 = iVar24 != 0, iVar24 = iVar24 + -1, bVar40) {
                        auVar2 = vmovdqa64_avx512f(auVar41);
                        *pauVar35 = auVar2;
                        pauVar35 = pauVar35 + 1;
                      }
                    }
                    for (iVar26 = 0; iVar26 < m_1.h; iVar26 = iVar26 + 1) {
                      auVar41 = vmovdqa64_avx512f(*pauVar19);
                      iVar27 = iVar7;
                      while (bVar40 = iVar27 != 0, iVar27 = iVar27 + -1, bVar40) {
                        auVar2 = vmovdqa64_avx512f(auVar41);
                        *pauVar35 = auVar2;
                        pauVar35 = pauVar35 + 1;
                      }
                      for (iVar27 = 0; iVar24 = iVar16, iVar27 < m_1.w; iVar27 = iVar27 + 1) {
                        auVar41 = vmovdqa64_avx512f(*pauVar19);
                        auVar2 = vmovdqa64_avx512f(auVar41);
                        *pauVar35 = auVar2;
                        pauVar19 = pauVar19 + 1;
                        pauVar35 = pauVar35 + 1;
                      }
                      while (iVar24 != 0) {
                        auVar2 = vmovdqa64_avx512f(auVar41);
                        *pauVar35 = auVar2;
                        pauVar35 = pauVar35 + 1;
                        iVar24 = iVar24 + -1;
                      }
                    }
                    pauVar19 = (undefined1 (*) [64])((long)pauVar19 + (long)(m_1.w << 4) * -4);
                    iVar26 = 0;
                    if (iVar20 < 1) {
                      iVar20 = iVar26;
                    }
                    for (; iVar26 != iVar20; iVar26 = iVar26 + 1) {
                      auVar41 = vmovdqa64_avx512f(*pauVar19);
                      iVar27 = iVar7;
                      while (bVar40 = iVar27 != 0, iVar27 = iVar27 + -1, bVar40) {
                        auVar2 = vmovdqa64_avx512f(auVar41);
                        *pauVar35 = auVar2;
                        pauVar35 = pauVar35 + 1;
                      }
                      lVar36 = 0;
                      for (iVar27 = 0; iVar27 < m_1.w; iVar27 = iVar27 + 1) {
                        auVar41 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar19 + lVar36));
                        auVar2 = vmovdqa64_avx512f(auVar41);
                        *(undefined1 (*) [64])(*pauVar35 + lVar36) = auVar2;
                        lVar36 = lVar36 + 0x40;
                      }
                      pauVar35 = (undefined1 (*) [64])(*pauVar35 + lVar36);
                      iVar27 = iVar16;
                      while (bVar40 = iVar27 != 0, iVar27 = iVar27 + -1, bVar40) {
                        auVar2 = vmovdqa64_avx512f(auVar41);
                        *pauVar35 = auVar2;
                        pauVar35 = pauVar35 + 1;
                      }
                    }
                    p_Var25 = pp_Var11[-3];
                    iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var25);
                  }
                  lVar36 = -0x80;
                  if (iVar7 == 2) {
                    iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var25);
                    uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
                    pauVar35 = (undefined1 (*) [64])
                               ((long)(m_1.w * iVar7 * 0x10) * 4 + (long)m_1.data);
                    uVar21 = 0;
                    uVar14 = 0;
                    if (0 < (int)uVar12) {
                      uVar14 = (ulong)uVar12;
                    }
                    uVar22 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var25);
                    if ((int)*(uint *)(&this->field_0xdc + (long)p_Var25) < 1) {
                      uVar22 = uVar21;
                    }
                    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var25);
                    if (iVar7 < 1) {
                      iVar7 = 0;
                    }
                    lVar15 = uVar14 * 0x40;
                    lVar23 = uVar22 * 0x40;
                    pauVar19 = (undefined1 (*) [64])m.data;
                    for (; (int)uVar21 != iVar7; uVar21 = (ulong)((int)uVar21 + 1)) {
                      lVar39 = 0;
                      for (lVar37 = 0; lVar15 + lVar37 != 0; lVar37 = lVar37 + -0x40) {
                        auVar41 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                     (pauVar35[(int)uVar12] + lVar37));
                        auVar41 = vmovdqa64_avx512f(auVar41);
                        *(undefined1 (*) [64])(*pauVar19 + lVar39) = auVar41;
                        lVar39 = lVar39 + 0x40;
                      }
                      pauVar19 = (undefined1 (*) [64])((long)pauVar19 - lVar37);
                      pauVar31 = pauVar35;
                      for (iVar16 = 0; lVar37 = lVar36, iVar16 < m_1.w; iVar16 = iVar16 + 1) {
                        auVar41 = vmovdqa64_avx512f(*pauVar31);
                        auVar41 = vmovdqa64_avx512f(auVar41);
                        *pauVar19 = auVar41;
                        pauVar31 = pauVar31 + 1;
                        pauVar19 = pauVar19 + 1;
                      }
                      for (; lVar23 + lVar37 != -0x80; lVar37 = lVar37 + -0x40) {
                        auVar41 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar31 + lVar37));
                        auVar41 = vmovdqa64_avx512f(auVar41);
                        *pauVar19 = auVar41;
                        pauVar19 = pauVar19 + 1;
                      }
                      pauVar35 = pauVar35 + -(long)m_1.w;
                    }
                    for (iVar7 = 0; iVar7 < m_1.h; iVar7 = iVar7 + 1) {
                      lVar39 = 0;
                      for (lVar37 = 0; lVar15 + lVar37 != 0; lVar37 = lVar37 + -0x40) {
                        auVar41 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                     (pauVar35[(int)uVar12] + lVar37));
                        auVar41 = vmovdqa64_avx512f(auVar41);
                        *(undefined1 (*) [64])(*pauVar19 + lVar39) = auVar41;
                        lVar39 = lVar39 + 0x40;
                      }
                      pauVar19 = (undefined1 (*) [64])((long)pauVar19 - lVar37);
                      for (iVar16 = 0; lVar37 = lVar36, iVar16 < m_1.w; iVar16 = iVar16 + 1) {
                        auVar41 = vmovdqa64_avx512f(*pauVar35);
                        auVar41 = vmovdqa64_avx512f(auVar41);
                        *pauVar19 = auVar41;
                        pauVar35 = pauVar35 + 1;
                        pauVar19 = pauVar19 + 1;
                      }
                      for (; lVar23 + lVar37 != -0x80; lVar37 = lVar37 + -0x40) {
                        auVar41 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar35 + lVar37));
                        auVar41 = vmovdqa64_avx512f(auVar41);
                        *pauVar19 = auVar41;
                        pauVar19 = pauVar19 + 1;
                      }
                    }
                    pauVar35 = pauVar35 + (long)m_1.w * -2;
                    iVar7 = 0;
                    if (iVar26 < 1) {
                      iVar26 = iVar7;
                    }
                    for (; iVar7 != iVar26; iVar7 = iVar7 + 1) {
                      lVar39 = 0;
                      for (lVar37 = 0; lVar15 + lVar37 != 0; lVar37 = lVar37 + -0x40) {
                        auVar41 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                     (pauVar35[(int)uVar12] + lVar37));
                        auVar41 = vmovdqa64_avx512f(auVar41);
                        *(undefined1 (*) [64])(*pauVar19 + lVar39) = auVar41;
                        lVar39 = lVar39 + 0x40;
                      }
                      pauVar19 = (undefined1 (*) [64])((long)pauVar19 - lVar37);
                      pauVar31 = pauVar35;
                      for (iVar16 = 0; lVar37 = lVar36, iVar16 < m_1.w; iVar16 = iVar16 + 1) {
                        auVar41 = vmovdqa64_avx512f(*pauVar31);
                        auVar41 = vmovdqa64_avx512f(auVar41);
                        *pauVar19 = auVar41;
                        pauVar31 = pauVar31 + 1;
                        pauVar19 = pauVar19 + 1;
                      }
                      for (; lVar23 + lVar37 != -0x80; lVar37 = lVar37 + -0x40) {
                        auVar41 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar31 + lVar37));
                        auVar41 = vmovdqa64_avx512f(auVar41);
                        *pauVar19 = auVar41;
                        pauVar19 = pauVar19 + 1;
                      }
                      pauVar35 = pauVar35 + -(long)m_1.w;
                    }
                  }
                  pPVar48 = this;
                  if (m_1.refcount != (int *)0x0) {
                    LOCK();
                    *m_1.refcount = *m_1.refcount + -1;
                    UNLOCK();
                    if (*m_1.refcount == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        free(m_1.data);
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if (m.refcount != (int *)0x0) {
                    LOCK();
                    *m.refcount = *m.refcount + -1;
                    UNLOCK();
                    if (*m.refcount == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        free(m.data);
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar13 = (ulong)((int)uVar13 + 1);
              }
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        m.dims = iVar26;
        if (*(int *)(&this->field_0xe0 + (long)p_Var25) == 0) {
          uVar32 = *(int *)(&this->field_0xe8 + (long)p_Var25) + iVar7 +
                   *(int *)(&this->field_0xec + (long)p_Var25);
          pMVar47 = top_blob;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var25) +
                               *(int *)(&this->field_0xdc + (long)p_Var25),
                      uVar12 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var25),uVar32,iVar46,
                      m.elemsize,0x10,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar47->c * pMVar47->cstep != 0) {
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            if (iVar46 < 1) {
              iVar46 = 0;
            }
            uVar51 = 0;
            pPVar48 = this;
            for (lVar36 = 0; lVar36 != CONCAT44(uVar51,iVar46); lVar36 = lVar36 + 1) {
              p_Var25 = this->_vptr_Padding_x86_avx512[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var25) == 0) {
                auVar41 = vpbroadcastd_avx512f
                                    (ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var25)));
              }
              else {
                auVar41 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                             (*(long *)(&this->field_0xf8 + (long)p_Var25) +
                                             lVar36 * 0x40));
              }
              uVar38 = 0;
              auVar2 = vmovdqu64_avx512f(auVar41);
              for (; uVar38 != uVar32; uVar38 = uVar38 + 1) {
                m.w = pMVar47->w;
                m.h = pMVar47->h;
                m.elemsize = pMVar47->elemsize;
                m.elempack = pMVar47->elempack;
                m.allocator = pMVar47->allocator;
                m.cstep = (long)m.h * (long)m.w;
                m.data = (void *)((long)pMVar47->data +
                                 uVar38 * m.elemsize * m.cstep +
                                 pMVar47->cstep * lVar36 * m.elemsize);
                m.refcount = (int *)0x0;
                m.dims = 2;
                m.d = 1;
                m.c = 1;
                p_Var25 = this->_vptr_Padding_x86_avx512[-3];
                uVar12 = (int)uVar38 - *(int *)(&this->field_0xe8 + (long)p_Var25);
                if ((int)uVar12 < 0 || iVar7 <= (int)uVar12) {
                  uVar8 = m.cstep & 0xffffffff;
                  if ((int)m.cstep < 1) {
                    uVar8 = 0;
                  }
                  while (iVar26 = (int)uVar8, uVar8 = (ulong)(iVar26 - 1), iVar26 != 0) {
                    auVar3 = vmovdqu64_avx512f(auVar41);
                    *(undefined1 (*) [64])m.data = auVar3;
                    m.data = (void *)((long)m.data + 0x40);
                  }
                }
                else {
                  m_1.w = bottom_blob->w;
                  m_1.h = bottom_blob->h;
                  m_1.elemsize = bottom_blob->elemsize;
                  m_1.elempack = bottom_blob->elempack;
                  m_1.allocator = bottom_blob->allocator;
                  m_1.cstep = (long)m_1.h * (long)m_1.w;
                  m_1.data = (void *)((long)bottom_blob->data +
                                     m_1.cstep * m_1.elemsize * (ulong)uVar12 +
                                     bottom_blob->cstep * lVar36 * m_1.elemsize);
                  m_1.refcount = (int *)0x0;
                  m_1.dims = 2;
                  m_1.d = 1;
                  m_1.c = 1;
                  v_03._8_8_ = pMVar47;
                  v_03._0_8_ = bottom_blob;
                  v_03._16_8_ = pPVar48;
                  v_03[6] = (float)iVar46;
                  v_03[7] = (float)uVar51;
                  v_03[8] = 0.0;
                  v_03[9] = 0.0;
                  v_03._40_8_ = local_120;
                  v_03._48_8_ = m_1.data;
                  v_03[0xe] = 0.0;
                  v_03[0xf] = 0.0;
                  pPVar49 = pPVar48;
                  padding_constant_pack16_avx512
                            (&m_1,&m,*(int *)(&pPVar48->field_0xd0 + (long)p_Var25),
                             *(int *)(&pPVar48->field_0xd4 + (long)p_Var25),
                             *(int *)(&pPVar48->field_0xd8 + (long)p_Var25),
                             *(int *)(&pPVar48->field_0xdc + (long)p_Var25),v_03);
                  auVar41 = vmovdqu64_avx512f(auVar2);
                  this = pPVar48;
                  pPVar48 = pPVar49;
                }
              }
            }
            return 0;
          }
          return -100;
        }
      }
    }
  }
  piVar4 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.c = iVar46;
  m.d = iVar7;
  m.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (m.elempack != 1) {
    auVar41 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar41 = vmovdqu64_avx512f(auVar41);
    m_1.data = auVar41._0_8_;
    m_1.elemsize = auVar41._16_8_;
    m_1.elempack = auVar41._24_4_;
    m_1._28_4_ = auVar41._28_4_;
    m_1.allocator = auVar41._32_8_;
    m_1.dims = auVar41._40_4_;
    m_1.w = auVar41._44_4_;
    m_1.h = auVar41._48_4_;
    m_1.d = auVar41._52_4_;
    m_1.c = auVar41._56_4_;
    m_1._60_4_ = auVar41._60_4_;
    m_1.refcount = (int *)opt->workspace_allocator;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar7 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86_avx512 +
                           (long)this->_vptr_Padding_x86_avx512[-3]),&m,top_blob,opt);
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar7;
}

Assistant:

int Padding_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}